

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O2

void plutovg_canvas_stroke_preserve(plutovg_canvas_t *canvas)

{
  plutovg_span_buffer_t *span_buffer;
  plutovg_span_buffer_t *span_buffer_00;
  
  span_buffer = &canvas->fill_spans;
  plutovg_rasterize(span_buffer,canvas->path,&canvas->state->matrix,&canvas->clip_rect,
                    &canvas->state->stroke,PLUTOVG_FILL_RULE_NON_ZERO);
  span_buffer_00 = span_buffer;
  if (canvas->state->clipping == true) {
    span_buffer_00 = &canvas->clip_spans;
    plutovg_span_buffer_intersect(span_buffer_00,span_buffer,&canvas->state->clip_spans);
  }
  plutovg_blend(canvas,span_buffer_00);
  return;
}

Assistant:

void plutovg_canvas_stroke_preserve(plutovg_canvas_t* canvas)
{
    plutovg_rasterize(&canvas->fill_spans, canvas->path, &canvas->state->matrix, &canvas->clip_rect, &canvas->state->stroke, PLUTOVG_FILL_RULE_NON_ZERO);
    if(canvas->state->clipping) {
        plutovg_span_buffer_intersect(&canvas->clip_spans, &canvas->fill_spans, &canvas->state->clip_spans);
        plutovg_blend(canvas, &canvas->clip_spans);
    } else {
        plutovg_blend(canvas, &canvas->fill_spans);
    }
}